

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<char,_ft::allocator<char>_>::deque
          (deque<char,_ft::allocator<char>_> *this,deque<char,_ft::allocator<char>_> *other)

{
  constDequeIterator<char,_64UL> local_78;
  constDequeIterator<char,_64UL> local_50;
  
  (this->m_start)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00110bc8;
  (this->m_finish)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_00110bc8;
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  dequeInit(this,other->m_size);
  constDequeIterator<char,_64UL>::constDequeIterator(&local_78,&other->m_start);
  constDequeIterator<char,_64UL>::constDequeIterator(&local_50,&other->m_finish);
  deque<char,ft::allocator<char>>::assign<ft::constDequeIterator<char,64ul>>
            ((deque<char,ft::allocator<char>> *)this,&local_78,&local_50,(type *)0x0);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}